

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_errblock(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos33;
  int yypos33;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchString(G,"~{");
  if (iVar4 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_braces(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar4 = yymatchChar(G,0x7d);
    if ((iVar4 != 0) && (iVar4 = yy__(G), iVar4 != 0)) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_errblock(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "errblock"));
  if (!yymatchString(G, "~{")) goto l31;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l31;
  l32:;	
  {  int yypos33= G->pos, yythunkpos33= G->thunkpos;  if (!yy_braces(G))  goto l33;
  goto l32;
  l33:;	  G->pos= yypos33; G->thunkpos= yythunkpos33;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l31;  if (!yymatchChar(G, '}')) goto l31;
  if (!yy__(G))  goto l31;
  yyprintf((stderr, "  ok   errblock"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l31:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "errblock"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}